

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::_::
ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
::disposeImpl(ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
              *this,void *param_1,size_t param_2,size_t param_3,size_t param_4,
             _func_void_void_ptr *param_5)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Array<unsigned_char> *pAVar4;
  RemoveConst<kj::Array<unsigned_char>_> *pRVar5;
  Array<unsigned_char> *pAVar6;
  
  pAVar1 = (this->
           super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
           ).first.ptr;
  if (pAVar1 != (ArrayPtr<const_unsigned_char> *)0x0) {
    sVar2 = (this->
            super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
            ).first.size_;
    (this->
    super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
    ).first.ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    (this->
    super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
    ).first.size_ = 0;
    pAVar3 = (this->
             super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
             ).first.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pAVar1,0x10,sVar2,sVar2,0);
  }
  pAVar4 = (this->
           super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
           ).super_OwnedBundle<kj::Vector<kj::Array<unsigned_char>_>_>.first.builder.ptr;
  if (pAVar4 != (Array<unsigned_char> *)0x0) {
    pRVar5 = (this->
             super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
             ).super_OwnedBundle<kj::Vector<kj::Array<unsigned_char>_>_>.first.builder.pos;
    pAVar6 = (this->
             super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
             ).super_OwnedBundle<kj::Vector<kj::Array<unsigned_char>_>_>.first.builder.endPtr;
    (this->
    super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
    ).super_OwnedBundle<kj::Vector<kj::Array<unsigned_char>_>_>.first.builder.ptr =
         (Array<unsigned_char> *)0x0;
    (this->
    super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
    ).super_OwnedBundle<kj::Vector<kj::Array<unsigned_char>_>_>.first.builder.pos =
         (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
    (this->
    super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
    ).super_OwnedBundle<kj::Vector<kj::Array<unsigned_char>_>_>.first.builder.endPtr =
         (Array<unsigned_char> *)0x0;
    pAVar3 = (this->
             super_OwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
             ).super_OwnedBundle<kj::Vector<kj::Array<unsigned_char>_>_>.first.builder.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pAVar4,0x18,((long)pRVar5 - (long)pAVar4 >> 3) * -0x5555555555555555,
               ((long)pAVar6 - (long)pAVar4 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::Array<unsigned_char>_>::destruct);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

void disposeImpl(void*, size_t, size_t, size_t, void (*)(void*)) const override { delete this; }